

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O2

int KYBER_marshal_private_key(CBB *out,KYBER_private_key *private_key)

{
  int iVar1;
  uint uVar2;
  uint8_t *s_output;
  
  iVar1 = CBB_add_space(out,&s_output,0x480);
  uVar2 = 0;
  if (iVar1 != 0) {
    vector_encode(s_output,(vector *)((long)&private_key->opaque + 0x1840),0xc);
    iVar1 = kyber_marshal_public_key(out,(public_key *)private_key);
    if (iVar1 != 0) {
      iVar1 = CBB_add_bytes(out,(private_key->opaque).bytes + 0x620,0x20);
      if (iVar1 != 0) {
        iVar1 = CBB_add_bytes(out,(private_key->opaque).bytes + 0x1e40,0x20);
        uVar2 = (uint)(iVar1 != 0);
      }
    }
  }
  return uVar2;
}

Assistant:

int KYBER_marshal_private_key(CBB *out,
                              const struct KYBER_private_key *private_key) {
  const struct private_key *const priv = private_key_from_external(private_key);
  uint8_t *s_output;
  if (!CBB_add_space(out, &s_output, kEncodedVectorSize)) {
    return 0;
  }
  vector_encode(s_output, &priv->s, kLog2Prime);
  if (!kyber_marshal_public_key(out, &priv->pub) ||
      !CBB_add_bytes(out, priv->pub.public_key_hash,
                     sizeof(priv->pub.public_key_hash)) ||
      !CBB_add_bytes(out, priv->fo_failure_secret,
                     sizeof(priv->fo_failure_secret))) {
    return 0;
  }
  return 1;
}